

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O3

void __thiscall
Memory::LargeHeapBlock::ResetMarks(LargeHeapBlock *this,ResetMarkFlags flags,Recycler *recycler)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  LargeObjectHeader *this_00;
  uint objectIndex;
  undefined8 *in_FS_OFFSET;
  
  if ((this->super_HeapBlock).needOOMRescan == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x381,"(!this->needOOMRescan)","!this->needOOMRescan");
    if (!bVar3) goto LAB_00246753;
    *puVar1 = 0;
  }
  this->lastCollectAllocCount = this->allocCount;
  uVar5 = GetMarkCount(this);
  if (uVar5 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x386,"(this->GetMarkCount() == 0)","this->GetMarkCount() == 0");
    if (!bVar3) goto LAB_00246753;
    *puVar1 = 0;
  }
  if ((this->super_HeapBlock).isPendingConcurrentSweep == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x389,"(!this->isPendingConcurrentSweep)","!this->isPendingConcurrentSweep")
    ;
    if (!bVar3) {
LAB_00246753:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  if (((flags & ResetMarkFlags_InThreadImplicitRoots) != ResetMarkFlags_HeapEnumeration) &&
     (this->allocCount != 0)) {
    uVar5 = 0;
    do {
      this_00 = GetHeaderByIndex(this,uVar5);
      if (this_00 != (LargeObjectHeader *)0x0) {
        bVar4 = LargeObjectHeader::GetAttributes(this_00,this->heapInfo->recycler->Cookie);
        if ((bVar4 & 8) != 0) {
          HeapBlockMap64::SetMark(&recycler->heapBlockMap,this_00 + 1);
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->allocCount);
  }
  return;
}

Assistant:

void
LargeHeapBlock::ResetMarks(ResetMarkFlags flags, Recycler* recycler)
{
    Assert(!this->needOOMRescan);

    // Update the lastCollectAllocCount for sweep
    this->lastCollectAllocCount = this->allocCount;

    Assert(this->GetMarkCount() == 0);

#if ENABLE_CONCURRENT_GC
    Assert(!this->isPendingConcurrentSweep);
#endif

    if (flags & ResetMarkFlags_ScanImplicitRoot)
    {
        for (uint objectIndex = 0; objectIndex < allocCount; objectIndex++)
        {
            // object is allocated during the concurrent mark or it is marked, do rescan
            LargeObjectHeader * header = this->GetHeaderByIndex(objectIndex);
            // check if the object index is not allocated
            if (header == nullptr)
            {
                continue;
            }

            // check whether the object is a leaf and doesn't need to be scanned
            if ((header->GetAttributes(this->heapInfo->recycler->Cookie) & ImplicitRootBit) != 0)
            {
                recycler->heapBlockMap.SetMark(header->GetAddress());
            }
        }
    }
}